

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLenum GVar2;
  char *pcVar3;
  code *ctx;
  uint local_43c;
  GLchar local_438 [8];
  char log [1000];
  GLsizei local_48;
  GLint local_44;
  GLsizei len;
  GLint status;
  FILE *fp;
  GLenum local_30;
  GLenum error;
  GLenum binaryFormat;
  GLsizei length;
  void *binary;
  GLsizei bufSize;
  GLint binaryLength;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _bufSize = argv;
  argv_local._0_4_ = argc;
  pcVar3 = getenv("DRY_RUN");
  tracing = (bool)((pcVar3 != (char *)0x0 ^ 0xffU) & 1);
  glfwInit();
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  window = glfwCreateWindow(0xfa,0xfa,*_bufSize,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(window);
    ctx = glfwGetProcAddress;
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      if (GLAD_GL_KHR_debug != 0) {
        ctx = debugMessageCallback;
        (*glad_glDebugMessageCallback)(debugMessageCallback,(void *)0x0);
      }
      init((EVP_PKEY_CTX *)ctx);
      reshape();
      draw();
      binary._4_4_ = 0;
      (*glad_glGetProgramiv)(program,0x8741,(GLint *)((long)&binary + 4));
      if ((((tracing & 1U) != 0) && (binary._4_4_ != 0)) || ((int)binary._4_4_ < 0)) {
        fprintf(_stderr,"error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n",(ulong)binary._4_4_
               );
        exit(1);
      }
      do {
        GVar2 = (*glad_glGetError)();
      } while (GVar2 != 0);
      if ((int)binary._4_4_ < 1) {
        local_43c = 0x2000000;
      }
      else {
        local_43c = binary._4_4_;
      }
      binary._0_4_ = local_43c;
      _binaryFormat = malloc((long)(int)local_43c);
      error = 0;
      local_30 = 0;
      (*glad_glGetProgramBinary)(program,(uint)binary,(GLsizei *)&error,&local_30,_binaryFormat);
      fp._4_4_ = (*glad_glGetError)();
      if (((tracing & 1U) != 0) && (fp._4_4_ == 0)) {
        fprintf(_stderr,"error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n",(ulong)binary._4_4_
               );
        exit(1);
      }
      if ((tracing & 1U) == 0) {
        _len = fopen("program_binary.bin","wb");
        fwrite(&local_30,4,1,_len);
        fwrite((void *)((long)&binary + 4),4,1,_len);
        fwrite(_binaryFormat,1,(long)(int)binary._4_4_,_len);
        fclose(_len);
      }
      free(_binaryFormat);
      (*glad_glDeleteShader)(fragShader);
      (*glad_glDeleteShader)(vertShader);
      (*glad_glDeleteProgram)(program);
      program = (*glad_glCreateProgram)();
      _len = fopen("program_binary.bin","rb");
      fread(&local_30,4,1,_len);
      fread((void *)((long)&binary + 4),4,1,_len);
      _binaryFormat = malloc((long)(int)binary._4_4_);
      fread(_binaryFormat,1,(long)(int)binary._4_4_,_len);
      fclose(_len);
      (*glad_glProgramBinary)(program,local_30,_binaryFormat,binary._4_4_);
      local_44 = 0;
      (*glad_glGetProgramiv)(program,0x8b82,&local_44);
      if (local_44 == 0) {
        (*glad_glGetProgramInfoLog)(program,1000,&local_48,local_438);
        fprintf(_stderr,"warning: glProgramBinary failed -- %s\n",local_438);
      }
      if (((tracing & 1U) != 0) && (local_44 != 0)) {
        exit(1);
      }
      if (local_44 != 0) {
        draw();
      }
      glfwDestroyWindow(window);
      glfwTerminate();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    tracing = !getenv("DRY_RUN");

    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
    if (!window) {
         return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress)) {
       return EXIT_FAILURE;
    }

    if (GLAD_GL_KHR_debug) {
        glDebugMessageCallback(&debugMessageCallback, NULL);
    }

    init();
    reshape();
    draw();

    GLint binaryLength = 0;
    glGetProgramiv(program, GL_PROGRAM_BINARY_LENGTH, &binaryLength);
    if ((tracing && binaryLength != 0) ||
        binaryLength < 0) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    while (glGetError() != GL_NO_ERROR) ;

    GLsizei bufSize = binaryLength > 0 ? binaryLength : 32 * 1024 * 1024;
    void *binary = malloc(bufSize);
    GLsizei length = 0;
    GLenum binaryFormat = GL_NONE;
    glGetProgramBinary(program, bufSize, &length, &binaryFormat, binary);
    GLenum error = glGetError();
    if (tracing && error == GL_NO_ERROR) {
        fprintf(stderr, "error: glGetProgramiv(GL_PROGRAM_BINARY_LENGTH) = %i\n", binaryLength);
        exit(EXIT_FAILURE);
    }

    FILE *fp;

    if (!tracing) {
        fp = fopen("program_binary.bin", "wb");
        fwrite(&binaryFormat, sizeof binaryFormat, 1, fp);
        fwrite(&binaryLength, sizeof binaryLength, 1, fp);
        fwrite(binary, 1, binaryLength, fp);
        fclose(fp);
    }

    free(binary);
   
    glDeleteShader(fragShader);
    glDeleteShader(vertShader);
    glDeleteProgram(program);

    program = glCreateProgram();

    fp = fopen("program_binary.bin", "rb");
    fread(&binaryFormat, sizeof binaryFormat, 1, fp);
    fread(&binaryLength, sizeof binaryLength, 1, fp);
    binary = malloc(binaryLength);
    fread(binary, 1, binaryLength, fp);
    fclose(fp);

    glProgramBinary(program, binaryFormat, binary, binaryLength);
    
    GLint status = 0;
    glGetProgramiv(program, GL_LINK_STATUS, &status);
    if (!status) {
        GLsizei len;
        char log[1000];
        glGetProgramInfoLog(program, sizeof log, &len, log);
        fprintf(stderr, "warning: glProgramBinary failed -- %s\n", log);
    }
    if (tracing && status) {
        exit(EXIT_FAILURE);
    }

    if (status) {
        draw();
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}